

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::SstReader::DoGetDeferred
          (SstReader *this,Variable<long_double> *variable,longdouble *data)

{
  SelectionType SVar1;
  size_t *Count;
  SstMarshalMethod SVar2;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->super_Engine).m_BetweenStepPairs == false) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Engine","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SstReader","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"DoGetDeferred","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "When using the SST engine in ADIOS2, Get() calls must appear between BeginStep/EndStep pairs"
               ,"");
    helper::Throw<std::logic_error>(&local_b0,&local_50,&local_70,&local_90,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  SVar2 = this->m_WriterMarshalMethod;
  if (SVar2 == SstMarshalFFS) {
    SVar1 = (variable->super_VariableBase).m_SelectionType;
    if (SVar1 == WriteBlock) {
      Count = (variable->super_VariableBase).m_Count.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
      SstFFSGetLocalDeferred
                (this->m_Input,variable,(variable->super_VariableBase).m_Name._M_dataplus._M_p,
                 (long)(variable->super_VariableBase).m_Count.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)Count >> 3,
                 (int)(variable->super_VariableBase).m_BlockID,Count,data);
    }
    else {
      if (SVar1 != BoundingBox) {
        return;
      }
      SstFFSGetDeferred(this->m_Input,variable,
                        (variable->super_VariableBase).m_Name._M_dataplus._M_p,
                        (long)(variable->super_VariableBase).m_Shape.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(variable->super_VariableBase).m_Shape.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3,
                        (variable->super_VariableBase).m_Start.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (variable->super_VariableBase).m_Count.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,data);
    }
    SVar2 = this->m_WriterMarshalMethod;
  }
  if (SVar2 == SstMarshalBP) {
    if ((variable->super_VariableBase).m_SingleValue == true) {
      *data = variable->m_Value;
      return;
    }
    adios2::format::BP3Deserializer::InitVariableBlockInfo<long_double>
              (this->m_BP3Deserializer,variable,data);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)(&this->m_BP3Deserializer->field_0x368 +
                  *(long *)(*(long *)this->m_BP3Deserializer + -0x18)),
               &(variable->super_VariableBase).m_Name);
    SVar2 = this->m_WriterMarshalMethod;
  }
  if (SVar2 == SstMarshalBP5) {
    adios2::format::BP5Deserializer::QueueGet
              (this->m_BP5Deserializer,&variable->super_VariableBase,data,false);
  }
  return;
}

Assistant:

void SstReader::DoGetStructSync(VariableStruct &variable, void *data)
{
    PERFSTUBS_SCOPED_TIMER("BP5Reader::Get");
    if (m_WriterMarshalMethod != SstMarshalBP5)
    {
        helper::Throw<std::runtime_error>(
            "Engine", "SstReader", "GetStructSync",
            "SST only supports struct transmission when BP5 marshalling is "
            "selected");
    }
    bool need_sync = m_BP5Deserializer->QueueGet(variable, data);
    if (need_sync)
        BP5PerformGets();
}